

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O0

_Bool option_set(char *name,int val)

{
  _Bool _Var1;
  int iVar2;
  ulong local_28;
  size_t opt;
  int val_local;
  char *name_local;
  
  local_28 = 0;
  while( true ) {
    if (0x2c < local_28) {
      return false;
    }
    if ((options[local_28].name != (char *)0x0) &&
       (iVar2 = strcmp(options[local_28].name,name), iVar2 == 0)) break;
    local_28 = local_28 + 1;
  }
  (player->opts).opt[local_28] = val != 0;
  if ((val != 0) && (_Var1 = option_is_cheat((int)local_28), _Var1)) {
    (player->opts).opt[local_28 + 1] = true;
  }
  return true;
}

Assistant:

bool option_set(const char *name, int val)
{
	size_t opt;

	/* Try normal options first */
	for (opt = 0; opt < OPT_MAX; opt++) {
		if (!options[opt].name || !streq(options[opt].name, name))
			continue;

		player->opts.opt[opt] = val ? true : false;
		if (val && option_is_cheat(opt))
			player->opts.opt[opt + 1] = true;

		return true;
	}

	return false;
}